

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * msort(char *list,char **next,_func_int_char_ptr_char_ptr *cmp)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *set [30];
  undefined8 local_118 [31];
  
  for (lVar2 = 0; lVar2 != 0x1e; lVar2 = lVar2 + 1) {
    local_118[lVar2] = 0;
  }
  lVar2 = (long)next - (long)list;
  while (list != (char *)0x0) {
    pcVar1 = *(char **)(list + lVar2);
    pcVar3 = list + lVar2;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    for (lVar4 = 0; (lVar4 != 0x1d && ((char *)local_118[lVar4] != (char *)0x0)); lVar4 = lVar4 + 1)
    {
      list = merge(list,(char *)local_118[lVar4],cmp,(int)lVar2);
      local_118[lVar4] = 0;
    }
    local_118[lVar4] = list;
    list = pcVar1;
  }
  pcVar3 = (char *)0x0;
  for (lVar4 = 0; lVar4 != 0x1e; lVar4 = lVar4 + 1) {
    if ((char *)local_118[lVar4] != (char *)0x0) {
      pcVar3 = merge((char *)local_118[lVar4],pcVar3,cmp,(int)lVar2);
    }
  }
  return pcVar3;
}

Assistant:

static char *msort(
  char *list,
  char **next,
  int (*cmp)(const char*,const char*)
){
  unsigned long offset;
  char *ep;
  char *set[LISTSIZE];
  int i;
  offset = (unsigned long)((char*)next - (char*)list);
  for(i=0; i<LISTSIZE; i++) set[i] = 0;
  while( list ){
    ep = list;
    list = NEXT(list);
    NEXT(ep) = 0;
    for(i=0; i<LISTSIZE-1 && set[i]!=0; i++){
      ep = merge(ep,set[i],cmp,offset);
      set[i] = 0;
    }
    set[i] = ep;
  }
  ep = 0;
  for(i=0; i<LISTSIZE; i++) if( set[i] ) ep = merge(set[i],ep,cmp,offset);
  return ep;
}